

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

void __thiscall llvm::cl::OptionCategory::registerCategory(OptionCategory *this)

{
  CommandLineParser *this_00;
  OptionCategory *this_local;
  
  this_00 = ManagedStatic<(anonymous_namespace)::CommandLineParser,_llvm::object_creator<(anonymous_namespace)::CommandLineParser>,_llvm::object_deleter<(anonymous_namespace)::CommandLineParser>_>
            ::operator->(&GlobalParser);
  anon_unknown.dwarf_f773b::CommandLineParser::registerCategory(this_00,this);
  return;
}

Assistant:

void OptionCategory::registerCategory() {
  GlobalParser->registerCategory(this);
}